

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringpiece.h
# Opt level: O1

bool re2::StringPiece::_equal(StringPiece *x,StringPiece *y)

{
  int iVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  iVar1 = x->length_;
  if (iVar1 == y->length_) {
    pcVar4 = x->ptr_;
    pcVar5 = y->ptr_;
    if ((iVar1 < 1) || (pcVar4[iVar1 - 1U] == pcVar5[iVar1 - 1U])) {
      bVar2 = iVar1 < 1;
      if (0 < iVar1) {
        pcVar3 = pcVar4 + iVar1;
        do {
          if (*pcVar4 != *pcVar5) {
            return false;
          }
          pcVar4 = pcVar4 + 1;
          pcVar5 = pcVar5 + 1;
          bVar2 = pcVar4 >= pcVar3;
        } while (pcVar4 < pcVar3);
      }
      return bVar2;
    }
  }
  return false;
}

Assistant:

int size() const { return length_; }